

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O3

void __thiscall btSimpleDynamicsWorld::setGravity(btSimpleDynamicsWorld *this,btVector3 *gravity)

{
  btRigidBody *this_00;
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  
  uVar1 = *(undefined8 *)(gravity->m_floats + 2);
  *(undefined8 *)(this->m_gravity).m_floats = *(undefined8 *)gravity->m_floats;
  *(undefined8 *)((this->m_gravity).m_floats + 2) = uVar1;
  iVar2 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      this_00 = (btRigidBody *)
                (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_data
                [lVar3];
      if ((this_00 != (btRigidBody *)0x0) &&
         (((this_00->super_btCollisionObject).m_internalType & 2U) != 0)) {
        btRigidBody::setGravity(this_00,gravity);
        iVar2 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::setGravity(const btVector3& gravity)
{
	m_gravity = gravity;
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body)
		{
			body->setGravity(gravity);
		}
	}
}